

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O2

ConvexH * ConvexDecomposition::ConvexHMakeCube(float3 *bmin,float3 *bmax)

{
  Array<ConvexDecomposition::Plane> *this;
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ConvexH *this_00;
  float3 *pfVar7;
  Plane *pPVar8;
  undefined1 auVar9 [16];
  float local_48;
  
  this_00 = test_cube();
  fVar1 = bmin->z;
  fVar2 = bmin->x;
  fVar3 = bmin->y;
  pfVar7 = Array<ConvexDecomposition::float3>::operator[](&this_00->vertices,0);
  pfVar7->x = fVar2;
  pfVar7->y = fVar3;
  pfVar7->z = fVar1;
  fVar1 = bmax->z;
  fVar2 = bmin->x;
  fVar3 = bmin->y;
  pfVar7 = Array<ConvexDecomposition::float3>::operator[](&this_00->vertices,1);
  pfVar7->x = fVar2;
  pfVar7->y = fVar3;
  pfVar7->z = fVar1;
  fVar1 = bmax->y;
  fVar2 = bmin->x;
  fVar3 = bmin->z;
  pfVar7 = Array<ConvexDecomposition::float3>::operator[](&this_00->vertices,2);
  pfVar7->x = fVar2;
  pfVar7->y = fVar1;
  pfVar7->z = fVar3;
  fVar1 = bmin->x;
  fVar2 = bmax->y;
  fVar3 = bmax->z;
  pfVar7 = Array<ConvexDecomposition::float3>::operator[](&this_00->vertices,3);
  pfVar7->x = fVar1;
  pfVar7->y = fVar2;
  pfVar7->z = fVar3;
  fVar1 = bmax->x;
  fVar2 = bmin->y;
  fVar3 = bmin->z;
  pfVar7 = Array<ConvexDecomposition::float3>::operator[](&this_00->vertices,4);
  pfVar7->x = fVar1;
  pfVar7->y = fVar2;
  pfVar7->z = fVar3;
  fVar1 = bmin->y;
  fVar2 = bmax->x;
  fVar3 = bmax->z;
  pfVar7 = Array<ConvexDecomposition::float3>::operator[](&this_00->vertices,5);
  pfVar7->x = fVar2;
  pfVar7->y = fVar1;
  pfVar7->z = fVar3;
  fVar1 = bmin->z;
  fVar2 = bmax->x;
  fVar3 = bmax->y;
  pfVar7 = Array<ConvexDecomposition::float3>::operator[](&this_00->vertices,6);
  pfVar7->x = fVar2;
  pfVar7->y = fVar3;
  pfVar7->z = fVar1;
  fVar1 = bmax->z;
  fVar2 = bmax->x;
  fVar3 = bmax->y;
  pfVar7 = Array<ConvexDecomposition::float3>::operator[](&this_00->vertices,7);
  this = &this_00->facets;
  pfVar7->x = fVar2;
  pfVar7->y = fVar3;
  pfVar7->z = fVar1;
  fVar1 = bmin->x;
  pPVar8 = Array<ConvexDecomposition::Plane>::operator[](this,0);
  uVar4 = vmovlps_avx(SUB6416(ZEXT464(0xbf800000),0));
  (pPVar8->normal).x = (float)(int)uVar4;
  (pPVar8->normal).y = (float)(int)((ulong)uVar4 >> 0x20);
  (pPVar8->normal).z = 0.0;
  pPVar8->dist = fVar1;
  auVar9._8_4_ = 0x80000000;
  auVar9._0_8_ = 0x8000000080000000;
  auVar9._12_4_ = 0x80000000;
  auVar9 = vxorps_avx512vl(ZEXT416((uint)bmax->x),auVar9);
  pPVar8 = Array<ConvexDecomposition::Plane>::operator[](this,1);
  uVar4 = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
  (pPVar8->normal).x = (float)(int)uVar4;
  (pPVar8->normal).y = (float)(int)((ulong)uVar4 >> 0x20);
  local_48 = auVar9._0_4_;
  (pPVar8->normal).z = 0.0;
  pPVar8->dist = local_48;
  fVar1 = bmin->y;
  pPVar8 = Array<ConvexDecomposition::Plane>::operator[](this,2);
  (pPVar8->normal).x = 0.0;
  (pPVar8->normal).y = -1.0;
  (pPVar8->normal).z = 0.0;
  pPVar8->dist = fVar1;
  auVar5._8_4_ = 0x80000000;
  auVar5._0_8_ = 0x8000000080000000;
  auVar5._12_4_ = 0x80000000;
  auVar9 = vxorps_avx512vl(ZEXT416((uint)bmax->y),auVar5);
  pPVar8 = Array<ConvexDecomposition::Plane>::operator[](this,3);
  (pPVar8->normal).x = 0.0;
  (pPVar8->normal).y = 1.0;
  local_48 = auVar9._0_4_;
  (pPVar8->normal).z = 0.0;
  pPVar8->dist = local_48;
  fVar1 = bmin->z;
  pPVar8 = Array<ConvexDecomposition::Plane>::operator[](this,4);
  (pPVar8->normal).x = 0.0;
  (pPVar8->normal).y = 0.0;
  (pPVar8->normal).z = -1.0;
  pPVar8->dist = fVar1;
  auVar6._8_4_ = 0x80000000;
  auVar6._0_8_ = 0x8000000080000000;
  auVar6._12_4_ = 0x80000000;
  auVar9 = vxorps_avx512vl(ZEXT416((uint)bmax->z),auVar6);
  pPVar8 = Array<ConvexDecomposition::Plane>::operator[](this,5);
  local_48 = auVar9._0_4_;
  (pPVar8->normal).x = 0.0;
  (pPVar8->normal).y = 0.0;
  (pPVar8->normal).z = 1.0;
  pPVar8->dist = local_48;
  return this_00;
}

Assistant:

ConvexH *ConvexHMakeCube(const REAL3 &bmin, const REAL3 &bmax) {
	ConvexH *convex = test_cube();
	convex->vertices[0] = REAL3(bmin.x,bmin.y,bmin.z);
	convex->vertices[1] = REAL3(bmin.x,bmin.y,bmax.z);
	convex->vertices[2] = REAL3(bmin.x,bmax.y,bmin.z);
	convex->vertices[3] = REAL3(bmin.x,bmax.y,bmax.z);
	convex->vertices[4] = REAL3(bmax.x,bmin.y,bmin.z);
	convex->vertices[5] = REAL3(bmax.x,bmin.y,bmax.z);
	convex->vertices[6] = REAL3(bmax.x,bmax.y,bmin.z);
	convex->vertices[7] = REAL3(bmax.x,bmax.y,bmax.z);

	convex->facets[0] = Plane(REAL3(-1,0,0), bmin.x);
	convex->facets[1] = Plane(REAL3(1,0,0), -bmax.x);
	convex->facets[2] = Plane(REAL3(0,-1,0), bmin.y);
	convex->facets[3] = Plane(REAL3(0,1,0), -bmax.y);
	convex->facets[4] = Plane(REAL3(0,0,-1), bmin.z);
	convex->facets[5] = Plane(REAL3(0,0,1), -bmax.z);
	return convex;
}